

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O2

void oss_gets_backsp(osgen_txtwin_t *win,char *buf,char **p,char **eol,int *x,int *y)

{
  int iVar1;
  int iVar2;
  char *__dest;
  int color;
  char *pcVar3;
  int tmpx;
  int tmpy;
  int local_38;
  int local_34;
  
  color = ossgetcolor((int)(win->base).txtfg,(int)(win->base).txtbg,(win->base).txtattr,
                      (int)(win->base).fillcolor);
  if (S_gets_internal_buf < *(char **)buf) {
    *(char **)buf = *(char **)buf + -1;
    pcVar3 = *p + -1;
    *p = pcVar3;
    __dest = *(char **)buf;
    if (__dest != pcVar3) {
      memmove(__dest,__dest + 1,(long)pcVar3 - (long)__dest);
    }
    iVar1 = *(int *)eol;
    *(int *)eol = iVar1 + -1;
    iVar2 = (win->base).winx;
    if (iVar1 <= iVar2) {
      *(int *)eol = iVar2 + (int)(win->base).wid + -1;
      *x = *x + -1;
    }
    **p = '\0';
    local_34 = *x;
    local_38 = *(int *)eol;
    ossdsp_str(&win->base,local_34,local_38,color,*(char **)buf,(long)*p - (long)*(char **)buf,
               (int *)0x0);
    oss_gets_csrright(win,&local_34,&local_38,(long)*p - *(long *)buf);
    ossclr(local_34,local_38,local_34,local_38,(win->base).oss_fillcolor);
  }
  return;
}

Assistant:

static void oss_gets_backsp(osgen_txtwin_t *win,
                            char *buf, char **p,
                            char **eol, int *x, int *y)
{
    int color;

    /* get the oss color for the current text in the window */
    color = ossgetcolor(win->base.txtfg, win->base.txtbg,
                        win->base.txtattr, win->base.fillcolor);

    /* if we can back up, do so */
    if (*p > buf)
    {
        int tmpy;
        int tmpx;

        /* move our insertion point back one position */
        --*p;
        
        /* the line is now one character shorter */
        --*eol;

        /* shift all of the characters down one position */
        if (*p != *eol)
            memmove(*p, *p + 1, *eol - *p);

        /* move the cursor back, wrapping if at the first column */
        if (--*x < win->base.winx)
        {
            *x = win->base.winx + win->base.wid - 1;
            --*y;
        }

        /* null-terminate the shortened buffer */
        **eol = '\0';

        /* 
         *   display the string from the current position, so that we update
         *   the display for the moved characters 
         */
        tmpy = *y;
        tmpx = *x;
        ossdsp_str(&win->base, tmpy, tmpx, color, *p, *eol - *p, 0);

        /* clear the screen area where the old last character was shown */
        oss_gets_csrright(win, &tmpy, &tmpx, *eol - *p);
        ossclr(tmpy, tmpx, tmpy, tmpx, win->base.oss_fillcolor);
    }
}